

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::errors<char[25],char[54]>(char (*args) [25],char (*args_1) [54])

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *in_RDX;
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  allocator_type *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  string *psVar1;
  iterator in_stack_fffffffffffffea8;
  undefined1 *puVar2;
  undefined1 local_10b;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  string local_e8 [55];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  string *local_70;
  string local_68 [32];
  undefined1 local_48 [32];
  string *local_28;
  undefined8 local_20;
  char *local_18;
  
  local_10a = 1;
  local_70 = local_68;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,in_RSI,&local_b1);
  std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  local_70 = (string *)local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,local_18,&local_109);
  std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  local_10a = 0;
  local_28 = local_68;
  local_20 = 2;
  puVar2 = &local_10b;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10bd0a);
  __l._M_len = (size_type)puVar2;
  __l._M_array = in_stack_fffffffffffffea8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffea0,__l,in_stack_fffffffffffffe98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10bd38);
  psVar1 = local_68;
  this = (string *)&local_28;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar1);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  return in_RDI;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}